

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

TFad<6,_double> * __thiscall TPZTensor<TFad<6,_double>_>::J2(TPZTensor<TFad<6,_double>_> *this)

{
  TFad<6,_double> *value_00;
  TFad<6,_double> *e1;
  TFad<6,_double> *e2;
  TFad<6,_double> *fadexpr;
  TFad<6,_double> *this_00;
  TFad<6,_double> *this_01;
  TFad<6,_double> *rhs;
  long in_RSI;
  TFad<6,_double> *in_RDI;
  TFad<6,_double> value;
  TPZVec<TFad<6,_double>_> s;
  TFad<6,_double> *in_stack_fffffffffffffe38;
  int64_t in_stack_fffffffffffffe68;
  TFad<6,_double> *in_stack_fffffffffffffe70;
  TFad<6,_double> *in_stack_fffffffffffffe78;
  TPZVec<TFad<6,_double>_> *in_stack_ffffffffffffff68;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffff70;
  TPZVec<TFad<6,_double>_> local_30;
  
  TPZVec<TFad<6,_double>_>::TPZVec
            ((TPZVec<TFad<6,_double>_> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  TPZTensor<TFad<6,double>>::DeviatoricDiagonal_T<TFad<6,double>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  value_00 = TPZVec<TFad<6,_double>_>::operator[](&local_30,0);
  TFad<6,_double>::operator-(in_stack_fffffffffffffe38);
  TPZVec<TFad<6,_double>_>::operator[](&local_30,1);
  ::operator*((TFadExpr<TFadUnaryMin<TFad<6,_double>_>_> *)in_stack_fffffffffffffe78,
              in_stack_fffffffffffffe70);
  TPZVec<TFad<6,_double>_>::operator[](&local_30,0);
  TPZVec<TFad<6,_double>_>::operator[](&local_30,2);
  ::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  ::operator-((TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>
               *)in_stack_fffffffffffffe78,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffe70);
  e1 = TPZVec<TFad<6,_double>_>::operator[](&local_30,1);
  e2 = TPZVec<TFad<6,_double>_>::operator[](&local_30,2);
  ::operator*(e1,e2);
  ::operator-((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  fadexpr = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  this_00 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),1);
  ::operator*(e1,e2);
  ::operator+((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  this_01 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),2);
  ::operator*(e1,e2);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  rhs = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RSI + 8),4);
  ::operator*(e1,e2);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  TFad<6,double>::
  TFad<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,double>>>,TFad<6,double>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>,TFadExpr<TFadBinaryMul<TFad<6,double>,TFad<6,double>>>>>
            (e2,(TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
                 *)fadexpr);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b803d);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b804a);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b8057);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b8064);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b8071);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b807e);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b808b);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b8098);
  TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryMinus<TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b80a5);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b80b2);
  TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFadExpr<TFadUnaryMin<TFad<6,_double>_>_>,_TFad<6,_double>_>_>
              *)0x14b80bf);
  TPZAssert::NonNegative<TFad<6,double>>(value_00);
  TFad<6,_double>::TFad(this_01,rhs);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b80ef);
  TPZVec<TFad<6,_double>_>::~TPZVec((TPZVec<TFad<6,_double>_> *)this_00);
  return in_RDI;
}

Assistant:

T TPZTensor<T>::J2() const {
    TPZVec<T> s(3);
    DeviatoricDiagonal_T<T>(s);
    T value = -s[0] * s[1] - s[0] * s[2] - s[1] * s[2] + fData[_XY_] * fData[_XY_] + fData[_XZ_] * fData[_XZ_] + fData[_YZ_] * fData[_YZ_];
    return TPZAssert::NonNegative(value);
}